

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O3

Vec_Vec_t * Saig_RefManOrderLiterals(Saig_RefMan_t *p,Vec_Int_t *vVar2PiId,Vec_Int_t *vAssumps)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Vec_t *pVVar4;
  void **__ptr;
  void *__s;
  void *pvVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint local_68;
  
  pVVar4 = (Vec_Vec_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  __ptr = (void **)malloc(800);
  pVVar4->pArray = __ptr;
  iVar1 = p->pAig->nTruePis;
  iVar2 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar2 = iVar1;
  }
  if (iVar2 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar2 << 2);
  }
  memset(__s,0xff,(long)iVar1 * 4);
  if (0 < vAssumps->nSize) {
    uVar7 = 0;
    local_68 = 100;
    lVar9 = 0;
    do {
      iVar2 = vAssumps->pArray[lVar9];
      uVar3 = iVar2 >> 1;
      if (((int)uVar3 < 0) || (vVar2PiId->nSize <= (int)uVar3)) {
LAB_00596428:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar3 = vVar2PiId->pArray[uVar3];
      if (((int)uVar3 < 0) || (p->pFrames->nObjs[2] <= (int)uVar3)) {
        __assert_fail("iPiNum >= 0 && iPiNum < Aig_ManCiNum(p->pFrames)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSat.c"
                      ,0x1c1,
                      "Vec_Vec_t *Saig_RefManOrderLiterals(Saig_RefMan_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      uVar8 = p->vMapPiF2A->nSize;
      if (((int)uVar8 <= (int)(uVar3 * 2)) || (uVar8 <= (uVar3 * 2 | 1))) goto LAB_00596428;
      uVar3 = p->vMapPiF2A->pArray[(ulong)uVar3 * 2];
      if (((int)uVar3 < 0) || (iVar1 <= (int)uVar3)) goto LAB_00596428;
      uVar8 = *(uint *)((long)__s + (ulong)uVar3 * 4);
      if (uVar8 == 0xffffffff) {
        *(uint *)((long)__s + (ulong)uVar3 * 4) = uVar7;
        uVar8 = uVar7;
      }
      if ((int)uVar7 <= (int)uVar8) {
        uVar3 = uVar8 + 1;
        if ((int)local_68 <= (int)uVar8) {
          if (__ptr == (void **)0x0) {
            __ptr = (void **)malloc((long)(int)uVar3 << 3);
          }
          else {
            __ptr = (void **)realloc(__ptr,(long)(int)uVar3 << 3);
          }
          pVVar4->pArray = __ptr;
          pVVar4->nCap = uVar3;
          local_68 = uVar3;
        }
        lVar6 = 0;
        do {
          pvVar5 = calloc(1,0x10);
          __ptr[(int)uVar7 + lVar6] = pvVar5;
          lVar6 = lVar6 + 1;
        } while ((uVar8 - uVar7) + 1 != (int)lVar6);
        pVVar4->nSize = uVar3;
        uVar7 = uVar3;
      }
      if (((int)uVar8 < 0) || ((int)uVar7 <= (int)uVar8)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecVec.h"
                      ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
      }
      __ptr = pVVar4->pArray;
      Vec_IntPush((Vec_Int_t *)__ptr[uVar8],iVar2);
      lVar9 = lVar9 + 1;
    } while (lVar9 < vAssumps->nSize);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  return pVVar4;
}

Assistant:

Vec_Vec_t * Saig_RefManOrderLiterals( Saig_RefMan_t * p, Vec_Int_t * vVar2PiId, Vec_Int_t * vAssumps )
{
    Vec_Vec_t * vLits;
    Vec_Int_t * vVar2New;
    int i, Entry, iInput, iFrame;
    // collect literals
    vLits = Vec_VecAlloc( 100 );
    vVar2New = Vec_IntStartFull( Saig_ManPiNum(p->pAig) );
    Vec_IntForEachEntry( vAssumps, Entry, i )
    {
        int iPiNum = Vec_IntEntry( vVar2PiId, lit_var(Entry) );
        assert( iPiNum >= 0 && iPiNum < Aig_ManCiNum(p->pFrames) );
        iInput = Vec_IntEntry( p->vMapPiF2A, 2*iPiNum );
        iFrame = Vec_IntEntry( p->vMapPiF2A, 2*iPiNum+1 );
//        Abc_InfoSetBit( pCare->pData, pCare->nRegs + pCare->nPis * iFrame + iInput );
        if ( Vec_IntEntry( vVar2New, iInput ) == ~0 )
            Vec_IntWriteEntry( vVar2New, iInput, Vec_VecSize(vLits) );
        Vec_VecPushInt( vLits, Vec_IntEntry( vVar2New, iInput ), Entry );
    }
    Vec_IntFree( vVar2New );
    return vLits;
}